

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O2

ostream * operator<<(ostream *os,TimeRepresentation<count_time<9,_long>_> *t1)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>
                     ((double)(t1->internalTimeCode % 1000000000) * 1e-09 +
                      (double)(t1->internalTimeCode / 1000000000));
  std::operator<<(poVar1,'s');
  return os;
}

Assistant:

std::ostream&
        operator<<(std::ostream& os, const TimeRepresentation& t1)
    {
        os << Tconv::toDouble(t1.internalTimeCode) << 's';
        return os;
    }